

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.hpp
# Opt level: O2

time_t cov::timer::time(time_t *__timer)

{
  long lVar1;
  long lVar2;
  
  switch((ulong)__timer & 0xffffffff) {
  case 0:
    lVar1 = std::chrono::_V2::system_clock::now();
    return lVar1 - m_timer;
  case 1:
    lVar1 = std::chrono::_V2::system_clock::now();
    lVar1 = lVar1 - m_timer;
    lVar2 = 1000;
    break;
  case 2:
    lVar1 = std::chrono::_V2::system_clock::now();
    lVar1 = lVar1 - m_timer;
    lVar2 = 1000000;
    break;
  case 3:
    lVar1 = std::chrono::_V2::system_clock::now();
    lVar1 = lVar1 - m_timer;
    lVar2 = 1000000000;
    break;
  case 4:
    lVar1 = std::chrono::_V2::system_clock::now();
    lVar1 = lVar1 - m_timer;
    lVar2 = 60000000000;
    break;
  default:
    return 0;
  }
  return lVar1 / lVar2;
}

Assistant:

static timer_t time(time_unit unit)
		{
			switch (unit) {
			case time_unit::nano_sec:
				return std::chrono::duration_cast<std::chrono::nanoseconds>(
				           std::chrono::high_resolution_clock::now() - m_timer).count();
			case time_unit::micro_sec:
				return std::chrono::duration_cast<std::chrono::microseconds>(
				           std::chrono::high_resolution_clock::now() - m_timer).count();
			case time_unit::milli_sec:
				return std::chrono::duration_cast<std::chrono::milliseconds>(
				           std::chrono::high_resolution_clock::now() - m_timer).count();
			case time_unit::second:
				return std::chrono::duration_cast<std::chrono::seconds>(
				           std::chrono::high_resolution_clock::now() - m_timer).count();
			case time_unit::minute:
				return std::chrono::duration_cast<std::chrono::minutes>(
				           std::chrono::high_resolution_clock::now() - m_timer).count();
			}
			return 0;
		}